

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void mct_encode_real(int *c0,int *c1,int *c2,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int v;
  int u;
  int y;
  int b;
  int g;
  int r;
  int i;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    iVar7 = *(int *)(in_RDI + (long)local_20 * 4);
    iVar8 = *(int *)(in_RSI + (long)local_20 * 4);
    iVar9 = *(int *)(in_RDX + (long)local_20 * 4);
    iVar1 = fix_mul(iVar7,0x991);
    iVar2 = fix_mul(iVar8,0x12c9);
    iVar3 = fix_mul(iVar9,0x3a6);
    iVar4 = fix_mul(iVar7,0x566);
    iVar5 = fix_mul(iVar8,0xa9a);
    iVar6 = fix_mul(iVar9,0x1000);
    iVar7 = fix_mul(iVar7,0x1000);
    iVar8 = fix_mul(iVar8,0xd66);
    iVar9 = fix_mul(iVar9,0x29a);
    *(int *)(in_RDI + (long)local_20 * 4) = iVar1 + iVar2 + iVar3;
    *(int *)(in_RSI + (long)local_20 * 4) = (-iVar5 - iVar4) + iVar6;
    *(int *)(in_RDX + (long)local_20 * 4) = (iVar7 - iVar8) - iVar9;
  }
  return;
}

Assistant:

void mct_encode_real(
		int* restrict c0,
		int* restrict c1,
		int* restrict c2,
		int n)
{
	int i;
	for(i = 0; i < n; ++i) {
		int r = c0[i];
		int g = c1[i];
		int b = c2[i];
		int y =  fix_mul(r, 2449) + fix_mul(g, 4809) + fix_mul(b, 934);
		int u = -fix_mul(r, 1382) - fix_mul(g, 2714) + fix_mul(b, 4096);
		int v =  fix_mul(r, 4096) - fix_mul(g, 3430) - fix_mul(b, 666);
		c0[i] = y;
		c1[i] = u;
		c2[i] = v;
	}
}